

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

vector<YAML::Node,_std::allocator<YAML::Node>_> * YAML::LoadAll(char *input)

{
  _Ios_Openmode _Var1;
  char *in_RSI;
  vector<YAML::Node,_std::allocator<YAML::Node>_> *in_RDI;
  stringstream stream;
  allocator local_1b9;
  string local_1b8 [32];
  stringstream local_198 [144];
  istream *in_stack_fffffffffffffef8;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,in_RSI,&local_1b9);
  _Var1 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_198,local_1b8,_Var1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  LoadAll(in_stack_fffffffffffffef8);
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::vector<Node> LoadAll(const char* input) {
  std::stringstream stream(input);
  return LoadAll(stream);
}